

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall tcu::CommandLine::CommandLine(CommandLine *this,string *cmdLine)

{
  bool bVar1;
  Exception *this_00;
  string local_50;
  
  this->_vptr_CommandLine = (_func_int **)&PTR_registerExtendedOptions_00b6f520;
  de::cmdline::detail::TypedFieldMap::TypedFieldMap(&(this->m_cmdLine).m_options);
  (this->m_cmdLine).m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cmdLine).m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cmdLine).m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = parse(this,cmdLine);
  if (bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Failed to parse command line","");
  Exception::Exception(this_00,&local_50);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

CommandLine::CommandLine (const std::string& cmdLine)
{
	if (!parse(cmdLine))
		throw Exception("Failed to parse command line");
}